

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::CompressionParameters>::setCapacity
          (Vector<kj::CompressionParameters> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::CompressionParameters> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::CompressionParameters> newBuilder;
  size_t newSize_local;
  Vector<kj::CompressionParameters> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::CompressionParameters>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::CompressionParameters>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::CompressionParameters>
            ((ArrayBuilder<kj::CompressionParameters> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::CompressionParameters>>(&this->builder);
  ArrayBuilder<kj::CompressionParameters>::addAll<kj::ArrayBuilder<kj::CompressionParameters>>
            ((ArrayBuilder<kj::CompressionParameters> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::CompressionParameters>>
                     ((ArrayBuilder<kj::CompressionParameters> *)local_38);
  ArrayBuilder<kj::CompressionParameters>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::CompressionParameters>::~ArrayBuilder
            ((ArrayBuilder<kj::CompressionParameters> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }